

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

void __thiscall
wasm::SuffixTreeTest_TestExclusion_Test::~SuffixTreeTest_TestExclusion_Test
          (SuffixTreeTest_TestExclusion_Test *this)

{
  SuffixTreeTest_TestExclusion_Test *this_local;
  
  ~SuffixTreeTest_TestExclusion_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SuffixTreeTest, TestExclusion) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 2, 1, 1, 3};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  bool IsExpectedIndex;
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    for (unsigned StartIdx : RS.StartIndices) {
      IsExpectedIndex = (StartIdx == 0u || StartIdx == 3u);
      EXPECT_TRUE(IsExpectedIndex);
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + RS.Length);
      EXPECT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}